

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall PlayerA::Stop(PlayerA *this)

{
  int iVar1;
  UINT8 retVal;
  PlayerA *this_local;
  
  if (this->_player == (PlayerBase *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    iVar1 = (*this->_player->_vptr_PlayerBase[0x20])();
    this_local._7_1_ = (UINT8)iVar1;
    iVar1 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar1 & 3;
    this->_myPlayState = this->_myPlayState | 0x20;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::Stop(void)
{
	if (_player == NULL)
		return 0xFF;
	UINT8 retVal = _player->Stop();
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	_myPlayState |= PLAYSTATE_FIN;
	return retVal;
}